

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.cc
# Opt level: O2

SpatialTransform *
RigidBodyDynamics::jcalc_XJ
          (SpatialTransform *__return_storage_ptr__,Model *model,uint joint_id,VectorNd *q)

{
  double dVar1;
  double dVar2;
  JointType JVar3;
  SpatialVector *pSVar4;
  double dVar5;
  double dVar6;
  pointer pJVar7;
  ostream *poVar8;
  RBDLError *this;
  string sStack_228;
  SpatialTransform local_208;
  ostringstream errormsg;
  
  pJVar7 = (model->mJoints).
           super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           .
           super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pJVar7[joint_id].mDoFCount == 1) {
    pJVar7 = pJVar7 + joint_id;
    JVar3 = pJVar7->mJointType;
    if (JVar3 == JointTypeHelical) {
      pSVar4 = pJVar7->mJointAxes;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1>;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] =
           *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 8);
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] =
           *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x10);
      Math::Xrot((SpatialTransform *)&errormsg,
                 (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data[pJVar7->q_index],(Vector3d *)&local_208);
      pJVar7 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar4 = pJVar7[joint_id].mJointAxes;
      local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] =
           (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
           [pJVar7[joint_id].q_index];
      local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[2] =
           *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28) *
           local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = 0.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = 0.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = 0.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[7] = 0.0;
      local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[0] =
           local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1] *
           *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
      local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
      m_storage.m_data.array[1] =
           local_208.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1] *
           *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = 0.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] = 0.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = 1.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = 1.0;
      local_208.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[8] = 1.0;
      Math::SpatialTransform::operator*
                (__return_storage_ptr__,(SpatialTransform *)&errormsg,&local_208);
    }
    else if (JVar3 == JointTypePrismatic) {
      pSVar4 = pJVar7->mJointAxes;
      dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [pJVar7->q_index];
      dVar2 = *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x28);
      dVar5 = *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x18);
      dVar6 = *(double *)((long)&pSVar4->super_Matrix<double,_6,_1,_0,_6,_1> + 0x20);
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
      (__return_storage_ptr__->E).super_Matrix3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
           dVar1 * dVar5;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
           dVar1 * dVar6;
      (__return_storage_ptr__->r).super_Vector3d.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           dVar2 * dVar1;
    }
    else {
      if (JVar3 != JointTypeRevolute) goto LAB_00241129;
      _errormsg = *(double *)&pJVar7->mJointAxes->super_Matrix<double,_6,_1,_0,_6,_1>;
      Math::Xrot(__return_storage_ptr__,
                 (q->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data[pJVar7->q_index],(Vector3d *)&errormsg);
    }
    return __return_storage_ptr__;
  }
LAB_00241129:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
  poVar8 = std::operator<<((ostream *)&errormsg,"Error: invalid joint type: ");
  poVar8 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)poVar8,
                      (model->mJoints).
                      super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                      ._M_impl.super__Vector_impl_data._M_start[joint_id].mJointType);
  std::endl<char,std::char_traits<char>>(poVar8);
  this = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(this,&sStack_228);
  __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI Math::SpatialTransform jcalc_XJ (
    Model &model,
    unsigned int joint_id,
    const Math::VectorNd &q) {
  // exception if we calculate it for the root body
  assert (joint_id > 0);

  if (model.mJoints[joint_id].mDoFCount == 1
      && model.mJoints[joint_id].mJointType != JointTypeCustom) {
    if (model.mJoints[joint_id].mJointType == JointTypeRevolute) {
      return Xrot (q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
    } else if (model.mJoints[joint_id].mJointType == JointTypePrismatic) {
      return Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
    } else if (model.mJoints[joint_id].mJointType == JointTypeHelical) {
      SpatialTransform rot = Xrot(
          q[model.mJoints[joint_id].q_index], Vector3d (
            model.mJoints[joint_id].mJointAxes[0][0],
            model.mJoints[joint_id].mJointAxes[0][1],
            model.mJoints[joint_id].mJointAxes[0][2]
            ));
      SpatialTransform trans = Xtrans ( Vector3d (
            model.mJoints[joint_id].mJointAxes[0][3]
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][4] 
            * q[model.mJoints[joint_id].q_index],
            model.mJoints[joint_id].mJointAxes[0][5] 
            * q[model.mJoints[joint_id].q_index]
            )
          );
      return rot * trans;
    }
  }

  std::ostringstream errormsg;
  errormsg << "Error: invalid joint type: " << model.mJoints[joint_id].mJointType << std::endl;
  throw Errors::RBDLError(errormsg.str());

  //never reaches this
  return SpatialTransform();
}